

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::SDLGraphicsSystem::throwOnInvalidTextureOperation
          (SDLGraphicsSystem *this,TextureId *id)

{
  long lVar1;
  runtime_error *this_00;
  
  if (this->isWindowCreated == false) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Cannot operate on textures when window not created");
  }
  else {
    lVar1 = (long)(this->textures).
                  super__Vector_base<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->textures).
                  super__Vector_base<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)id->t < (ulong)(lVar1 / 0x28)) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10,0x28,lVar1 % 0x28);
    std::runtime_error::runtime_error(this_00,"Unknown texture id: " + id->t);
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SDLGraphicsSystem::throwOnInvalidTextureOperation(const TextureId id) const {
    if (not isWindowCreated)
        throw std::runtime_error {"Cannot operate on textures when window not created"};

    if (id.t >= textures.size())
        throw std::runtime_error {"Unknown texture id: " + id};
}